

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

bool __thiscall
flexbuffers::Builder::StringOffsetCompare::operator()
          (StringOffsetCompare *this,StringOffset *a,StringOffset *b)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  puVar1 = (this->buf_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = b->second;
  uVar3 = a->second;
  uVar5 = uVar3;
  if (uVar2 < uVar3) {
    uVar5 = uVar2;
  }
  iVar4 = memcmp(puVar1 + a->first,puVar1 + b->first,uVar5 + 1);
  return iVar4 < 0 || uVar3 < uVar2 && iVar4 == 0;
}

Assistant:

bool operator()(const StringOffset &a, const StringOffset &b) const {
      auto stra = buf_->data() + a.first;
      auto strb = buf_->data() + b.first;
      auto cr = memcmp(stra, strb, (std::min)(a.second, b.second) + 1);
      return cr < 0 || (cr == 0 && a.second < b.second);
    }